

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.c
# Opt level: O1

void Panning_Calculate(INT32 *channels,INT16 position)

{
  short sVar1;
  undefined2 in_register_00000032;
  double dVar3;
  int iVar2;
  
  sVar1 = 0x200;
  if (CONCAT22(in_register_00000032,position) < 0x101) {
    iVar2 = 0xff00;
    if (-0x100 < position) {
      iVar2 = CONCAT22(in_register_00000032,position);
    }
    sVar1 = (short)iVar2 + 0x100;
  }
  dVar3 = sin((double)(int)sVar1 * 0.0030679615757712823);
  channels[1] = (int)(dVar3 * 1.4142135623730951 * 65536.0);
  dVar3 = sin((double)(int)(short)(0x200 - sVar1) * 0.0030679615757712823);
  *channels = (int)(dVar3 * 1.4142135623730951 * 65536.0);
  return;
}

Assistant:

void Panning_Calculate(INT32 channels[2], INT16 position)
{
	if ( position > RANGE / 2 )
		position = RANGE / 2;
	else if ( position < -RANGE / 2 )
		position = -RANGE / 2;
	position += RANGE / 2;	// make -256..0..256 -> 0..256..512
	
	// Equal power law: equation is
	// right = sin( position / range * pi / 2) * sqrt( 2 )
	// left is equivalent to right with position = range - position
	// position is in the range 0 .. RANGE
	// RANGE / 2 = centre, result = 1.0f
	channels[1] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
	position = RANGE - position;
	channels[0] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
}